

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HDual.cpp
# Opt level: O3

double __thiscall HDual::an_bs_cond(HDual *this,HModel *ptr_model)

{
  HVector *this_00;
  double dVar1;
  pointer piVar2;
  pointer pdVar3;
  pointer pdVar4;
  pointer piVar5;
  pointer pdVar6;
  pointer pdVar7;
  pointer pdVar8;
  undefined1 auVar9 [16];
  long lVar10;
  ulong uVar11;
  int iVar12;
  vector<double,_std::allocator<double>_> *this_01;
  long lVar13;
  ulong uVar14;
  int iVar15;
  ulong uVar16;
  double dVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  double dVar20;
  double dVar21;
  undefined1 auVar22 [16];
  
  this->model = ptr_model;
  this->matrix = &ptr_model->matrix;
  piVar2 = (ptr_model->matrix).Astart.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar3 = (ptr_model->matrix).Avalue.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  this_01 = &this->bs_cond_x;
  std::vector<double,_std::allocator<double>_>::resize(this_01,(long)this->numRow);
  std::vector<double,_std::allocator<double>_>::resize(&this->bs_cond_y,(long)this->numRow);
  std::vector<double,_std::allocator<double>_>::resize(&this->bs_cond_z,(long)this->numRow);
  std::vector<double,_std::allocator<double>_>::resize(&this->bs_cond_w,(long)this->numRow);
  auVar9 = _DAT_001560a0;
  iVar12 = this->numRow;
  if (0 < (long)iVar12) {
    pdVar4 = (this_01->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar10 = (long)iVar12 + -1;
    auVar18._8_4_ = (int)lVar10;
    auVar18._0_8_ = lVar10;
    auVar18._12_4_ = (int)((ulong)lVar10 >> 0x20);
    lVar10 = 0;
    auVar18 = auVar18 ^ _DAT_001560a0;
    auVar19 = _DAT_00156090;
    do {
      auVar22 = auVar19 ^ auVar9;
      if ((bool)(~(auVar22._4_4_ == auVar18._4_4_ && auVar18._0_4_ < auVar22._0_4_ ||
                  auVar18._4_4_ < auVar22._4_4_) & 1)) {
        *(double *)((long)pdVar4 + lVar10) = 1.0 / (double)iVar12;
      }
      if ((auVar22._12_4_ != auVar18._12_4_ || auVar22._8_4_ <= auVar18._8_4_) &&
          auVar22._12_4_ <= auVar18._12_4_) {
        *(double *)((long)pdVar4 + lVar10 + 8) = 1.0 / (double)iVar12;
      }
      lVar13 = auVar19._8_8_;
      auVar19._0_8_ = auVar19._0_8_ + 2;
      auVar19._8_8_ = lVar13 + 2;
      lVar10 = lVar10 + 0x10;
    } while ((ulong)(iVar12 + 1U >> 1) << 4 != lVar10);
  }
  this_00 = &this->row_ep;
  HVector::clear(this_00);
  iVar12 = this->numRow;
  (this->row_ep).count = iVar12;
  if (0 < iVar12) {
    pdVar4 = (this->bs_cond_x).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar5 = (this->row_ep).index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar6 = (this->row_ep).array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar10 = 0;
    do {
      piVar5[lVar10] = (int)lVar10;
      pdVar6[lVar10] = pdVar4[lVar10];
      lVar10 = lVar10 + 1;
    } while (lVar10 < this->numRow);
  }
  iVar12 = 1;
  do {
    (this->row_ep).packFlag = false;
    HFactor::ftran(this->factor,this_00,1.0);
    iVar15 = this->numRow;
    if (0 < (long)iVar15) {
      pdVar4 = (this->row_ep).array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar6 = (this->bs_cond_y).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar7 = (this->bs_cond_w).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar10 = 0;
      do {
        dVar17 = pdVar4[lVar10];
        pdVar6[lVar10] = dVar17;
        if (dVar17 <= 0.0) {
          if (0.0 <= dVar17) {
            pdVar7[lVar10] = 0.0;
          }
          else {
            pdVar7[lVar10] = -1.0;
          }
        }
        else {
          pdVar7[lVar10] = 1.0;
        }
        lVar10 = lVar10 + 1;
      } while (iVar15 != lVar10);
    }
    HVector::clear(this_00);
    iVar15 = this->numRow;
    (this->row_ep).count = iVar15;
    if (0 < iVar15) {
      pdVar4 = (this->bs_cond_w).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar5 = (this->row_ep).index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar6 = (this->row_ep).array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar10 = 0;
      do {
        piVar5[lVar10] = (int)lVar10;
        pdVar6[lVar10] = pdVar4[lVar10];
        lVar10 = lVar10 + 1;
      } while (lVar10 < this->numRow);
    }
    (this->row_ep).packFlag = false;
    HFactor::btran(this->factor,this_00,1.0);
    iVar15 = this->numRow;
    uVar11 = (ulong)iVar15;
    if ((long)uVar11 < 1) {
      dVar17 = 0.0;
      goto LAB_001160e0;
    }
    pdVar4 = (this->row_ep).array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar6 = (this->bs_cond_z).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar7 = (this->bs_cond_x).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar8 = (this->bs_cond_y).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar16 = 0xffffffff;
    dVar17 = 0.0;
    uVar14 = 0;
    dVar21 = 0.0;
    dVar20 = 0.0;
    do {
      dVar1 = pdVar4[uVar14];
      pdVar6[uVar14] = dVar1;
      if (dVar20 < ABS(dVar1)) {
        uVar16 = uVar14 & 0xffffffff;
        dVar20 = ABS(dVar1);
      }
      dVar21 = dVar21 + dVar1 * pdVar7[uVar14];
      dVar17 = dVar17 + ABS(pdVar8[uVar14]);
      uVar14 = uVar14 + 1;
    } while (uVar11 != uVar14);
    if (dVar20 <= dVar21) break;
    if (0 < iVar15) {
      memset((this_01->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start,0,uVar11 << 3);
    }
    HVector::clear(this_00);
    (this->row_ep).count = 1;
    iVar15 = (int)uVar16;
    *(this->row_ep).index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
     super__Vector_impl_data._M_start = iVar15;
    (this->row_ep).array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[iVar15] = 1.0;
    (this->bs_cond_x).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[iVar15] = 1.0;
    iVar12 = iVar12 + 1;
  } while (iVar12 != 6);
  if ((long)this->numRow < 1) {
LAB_001160e0:
    dVar20 = 0.0;
  }
  else {
    dVar20 = 0.0;
    lVar10 = 0;
    do {
      iVar12 = (this->model->basicIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[lVar10];
      dVar21 = 1.0;
      if (iVar12 < this->numCol) {
        iVar15 = piVar2[iVar12];
        lVar13 = (long)iVar15;
        iVar12 = piVar2[(long)iVar12 + 1];
        dVar21 = 0.0;
        if (iVar15 < iVar12) {
          do {
            dVar21 = dVar21 + ABS(pdVar3[lVar13]);
            lVar13 = lVar13 + 1;
          } while (iVar12 != lVar13);
        }
      }
      if (dVar20 <= dVar21) {
        dVar20 = dVar21;
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 != this->numRow);
  }
  return dVar17 * dVar20;
}

Assistant:

double HDual::an_bs_cond(HModel *ptr_model) {
  model = ptr_model;
  // Alias to the matrix
  matrix = model->getMatrix();
  const int *Astart = matrix->getAstart();
  const double *Avalue = matrix->getAvalue();
  //Compute the Hager condition number estimate for the basis matrix
  double NoDensity = 1;
  bs_cond_x.resize(numRow);
  bs_cond_y.resize(numRow);
  bs_cond_z.resize(numRow);
  bs_cond_w.resize(numRow);
  //x = ones(n,1)/n;
  //y = A\x;
  double mu = 1.0/numRow;
  double norm_Binv;
  for (int r_n=0; r_n < numRow; r_n++) bs_cond_x[r_n] = mu;
  row_ep.clear();
  row_ep.count = numRow;
  for (int r_n=0; r_n < numRow; r_n++) {
    row_ep.index[r_n] = r_n;
    row_ep.array[r_n] = bs_cond_x[r_n];
  }
  for (int ps_n=1; ps_n <= 5; ps_n++) {
    row_ep.packFlag = false;
    factor->ftran(row_ep, NoDensity);
  //zeta = sign(y);
    for (int r_n=0; r_n < numRow; r_n++) {
      bs_cond_y[r_n] = row_ep.array[r_n];
      if (bs_cond_y[r_n] > 0)
	bs_cond_w[r_n] =  1.0;
      else if (bs_cond_y[r_n] < 0)
	bs_cond_w[r_n] = -1.0;
      else	  
        bs_cond_w[r_n] =  0.0;
    }
  //z=A'\zeta;
    row_ep.clear();
    row_ep.count = numRow;
    for (int r_n=0; r_n < numRow; r_n++) {
      row_ep.index[r_n] = r_n;
      row_ep.array[r_n] = bs_cond_w[r_n];
    }
    row_ep.packFlag = false;
    factor->btran(row_ep, NoDensity);
  //norm_z = norm(z,'inf');
  //ztx = z'*x ;
  //NormEst = norm(y,1);
  //fd_i = 0;
  //for i=1:n
  //    if abs(z(i)) == norm_z
  //        fd_i = i;
  //        break
  //    end
  //end
    double norm_z = 0.0;
    double ztx = 0.0;
    norm_Binv = 0.0;
    int argmax_z = -1;
    for (int r_n=0; r_n < numRow; r_n++) {
      bs_cond_z[r_n] = row_ep.array[r_n];
      double abs_z_v = abs(bs_cond_z[r_n]);
	if (abs_z_v > norm_z) {
	  norm_z = abs_z_v;
	  argmax_z = r_n;
	}
      ztx += bs_cond_z[r_n]*bs_cond_x[r_n];
      norm_Binv += abs(bs_cond_y[r_n]);
    }
    //printf("%2d: ||z||_inf = %8.2g; z^T*x = %8.2g; ||y||_1 = %g\n", ps_n, norm_z, ztx, norm_Binv);
    if (norm_z <= ztx) break;
  //x = zeros(n,1);
  //x(fd_i) = 1;
    for (int r_n=0; r_n < numRow; r_n++) bs_cond_x[r_n] = 0.0;
    row_ep.clear();
    row_ep.count = 1;
    row_ep.index[0] = argmax_z;
    row_ep.array[argmax_z] = 1.0;
    bs_cond_x[argmax_z] = 1.0;
  }
  double norm_B = 0.0;
  for (int r_n=0; r_n < numRow; r_n++) {
    int vr_n = model->getBaseIndex()[r_n];
    double c_norm = 0.0;
    if (vr_n < numCol) 
      for (int el_n=Astart[vr_n]; el_n < Astart[vr_n+1]; el_n++) c_norm += abs(Avalue[el_n]);
    else 
      c_norm += 1.0;
    norm_B = max(c_norm, norm_B);
  }
  double cond_B = norm_Binv * norm_B;
 // printf("Hager estimate of ||B^{-1}||_1 = %g; ||B||_1 = %g so cond_1(B) estimate is %g\n", norm_Binv, norm_B, cond_B);
  return cond_B;
}